

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib.c
# Opt level: O0

void ndn_fib_remove_entry_if_empty(ndn_fib_t *self,ndn_fib_entry_t *entry)

{
  ndn_fib_entry_t *entry_local;
  ndn_fib_t *self_local;
  
  if (((entry->nametree_id != 0xffff) && (entry->nexthop == 0)) &&
     (entry->on_interest == (ndn_on_interest_func)0x0)) {
    ndn_fib_remove_entry(self,entry);
  }
  return;
}

Assistant:

void
ndn_fib_remove_entry_if_empty(ndn_fib_t* self, ndn_fib_entry_t* entry)
{
  if(entry->nametree_id == NDN_INVALID_ID){
    return;
  }
  if(entry->nexthop == 0 && entry->on_interest == NULL){
    ndn_fib_remove_entry(self, entry);
  }
}